

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O1

void __thiscall xray_re::mp_rpoint_io::operator()(mp_rpoint_io *this,mp_rpoint *rpoint,xr_writer *w)

{
  float local_1c;
  
  local_1c = (rpoint->p).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (rpoint->p).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (rpoint->p).field_0.field_0.z;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (rpoint->a).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (rpoint->a).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = *(float *)((long)&(rpoint->a).field_0 + 8);
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c._0_1_ = rpoint->team;
  (*w->_vptr_xr_writer[2])(w,&local_1c,1);
  local_1c._0_1_ = rpoint->respawn;
  (*w->_vptr_xr_writer[2])(w,&local_1c,1);
  local_1c._0_1_ = rpoint->game;
  (*w->_vptr_xr_writer[2])(w,&local_1c,1);
  local_1c = (float)((uint)local_1c._1_3_ << 8);
  (*w->_vptr_xr_writer[2])(w,&local_1c,1);
  return;
}

Assistant:

void mp_rpoint_io::operator()(const mp_rpoint* rpoint, xr_writer& w) const {
	w.w_fvector3(rpoint->p);
	w.w_fvector3(rpoint->a);
	w.w_u8(rpoint->team);
	w.w_u8(rpoint->respawn);
	w.w_u8(rpoint->game);
	w.w_u8(0);
}